

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-pprint.hh
# Opt level: O2

ostream * std::operator<<(ostream *os,vector<bool,_std::allocator<bool>_> *v)

{
  size_t i;
  ulong __n;
  
  std::operator<<(os,"[");
  for (__n = 0; __n < (ulong)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
                      ((long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                             super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
                      (long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8;
      __n = __n + 1) {
    vector<bool,_std::allocator<bool>_>::operator[](v,__n);
    std::ostream::_M_insert<bool>(SUB81(os,0));
    if (__n != ((ulong)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                       super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
               ((long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
               (long)(v->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                     super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) - 1) {
      std::operator<<(os,", ");
    }
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const std::vector<T> &v) {
  os << "[";
  for (size_t i = 0; i < v.size(); i++) {
    os << v[i];
    if (i != (v.size() - 1)) {
      os << ", ";
    }
  }
  os << "]";
  return os;
}